

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O3

int WebPWriteAlphaPlane(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  uint8_t *__ptr;
  uint uVar5;
  
  iVar4 = 0;
  if ((buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) &&
     (__ptr = (buffer->u).YUVA.a, iVar4 = 0, __ptr != (uint8_t *)0x0)) {
    uVar5 = buffer->height;
    iVar1 = (buffer->u).YUVA.a_stride;
    uVar2 = buffer->width;
    fprintf((FILE *)fout,"P5\n%u %u\n255\n",(ulong)uVar2,(ulong)uVar5);
    iVar4 = 1;
    for (; uVar5 != 0; uVar5 = uVar5 - 1) {
      sVar3 = fwrite(__ptr,(ulong)uVar2,1,(FILE *)fout);
      if (sVar3 != 1) {
        return 0;
      }
      __ptr = __ptr + iVar1;
    }
  }
  return iVar4;
}

Assistant:

int WebPWriteAlphaPlane(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    const uint8_t* a = buffer->u.YUVA.a;
    const int a_stride = buffer->u.YUVA.a_stride;
    uint32_t y;

    if (a == NULL) return 0;

    fprintf(fout, "P5\n%u %u\n255\n", width, height);
    for (y = 0; y < height; ++y) {
      if (fwrite(a, width, 1, fout) != 1) return 0;
      a += a_stride;
    }
    return 1;
  }
}